

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O2

int __thiscall
VVCStreamReader::toFullPicOrder(VVCStreamReader *this,VvcSliceHeader *slice,int pic_bits)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  bVar2 = VvcSliceHeader::isIDR(slice);
  if (bVar2) {
    iVar3 = this->m_frameNum;
    this->m_picOrderBase = iVar3;
    this->m_picOrderMsb = 0;
    this->m_prevPicOrder = 0;
    uVar1 = slice->pic_order_cnt_lsb;
    iVar5 = 0;
  }
  else {
    iVar5 = 1 << ((byte)pic_bits & 0x1f);
    uVar1 = slice->pic_order_cnt_lsb;
    iVar3 = this->m_prevPicOrder;
    uVar4 = (uint)uVar1;
    if (((int)(uint)uVar1 < iVar3) && (iVar5 / 2 <= (int)(iVar3 - (uint)uVar1))) {
      this->m_picOrderMsb = this->m_picOrderMsb + iVar5;
    }
    else if ((iVar3 < (int)uVar4) && (iVar5 / 2 <= (int)(uVar4 - iVar3))) {
      this->m_picOrderMsb = this->m_picOrderMsb - iVar5;
    }
    this->m_prevPicOrder = uVar4;
    iVar3 = this->m_picOrderBase;
    iVar5 = this->m_picOrderMsb;
  }
  return (uint)uVar1 + iVar5 + iVar3;
}

Assistant:

int VVCStreamReader::toFullPicOrder(const VvcSliceHeader* slice, const int pic_bits)
{
    if (slice->isIDR())
    {
        m_picOrderBase = m_frameNum;
        m_picOrderMsb = 0;
        m_prevPicOrder = 0;
    }
    else
    {
        const int range = 1 << pic_bits;

        if (slice->pic_order_cnt_lsb < m_prevPicOrder && m_prevPicOrder - slice->pic_order_cnt_lsb >= range / 2)
            m_picOrderMsb += range;
        else if (slice->pic_order_cnt_lsb > m_prevPicOrder && slice->pic_order_cnt_lsb - m_prevPicOrder >= range / 2)
            m_picOrderMsb -= range;

        m_prevPicOrder = slice->pic_order_cnt_lsb;
    }

    return slice->pic_order_cnt_lsb + m_picOrderMsb + m_picOrderBase;
}